

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_util.h
# Opt level: O2

void webrtc::Interleave<float>
               (float **deinterleaved,size_t samples_per_channel,size_t num_channels,
               float *interleaved)

{
  float *pfVar1;
  size_t sVar2;
  float *pfVar3;
  size_t j;
  size_t sVar4;
  
  for (sVar2 = 0; sVar2 != num_channels; sVar2 = sVar2 + 1) {
    pfVar1 = deinterleaved[sVar2];
    pfVar3 = interleaved;
    for (sVar4 = 0; samples_per_channel != sVar4; sVar4 = sVar4 + 1) {
      *pfVar3 = pfVar1[sVar4];
      pfVar3 = pfVar3 + num_channels;
    }
    interleaved = interleaved + 1;
  }
  return;
}

Assistant:

void Interleave(const T* const* deinterleaved,
                size_t samples_per_channel,
                size_t num_channels,
                T* interleaved) {
  for (size_t i = 0; i < num_channels; ++i) {
    const T* channel = deinterleaved[i];
    size_t interleaved_idx = i;
    for (size_t j = 0; j < samples_per_channel; ++j) {
      interleaved[interleaved_idx] = channel[j];
      interleaved_idx += num_channels;
    }
  }
}